

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O0

file_id * idx2::ConstructFilePath(file_id *__return_storage_ptr__,idx2_file *Idx2,u64 BrickAddress)

{
  long lVar1;
  byte Level_00;
  byte local_a9;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82 [6];
  i8 Subband;
  i8 Level;
  i16 BitPlane;
  u64 Brick;
  u64 BrickAddress_local;
  idx2_file *Idx2_local;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  u64 local_48;
  idx2_file *local_40;
  byte local_31;
  ulong uStack_30;
  i8 I;
  uint local_24;
  stack_array<int,_16> *local_20;
  char local_11;
  ulong local_10;
  
  local_50 = local_82 + 2;
  local_58 = &local_83;
  local_60 = &local_84;
  Idx2_local = (idx2_file *)local_82;
  Level_00 = (byte)(BrickAddress >> 0x3c);
  local_20 = &Idx2->BricksPerFile;
  local_24 = (uint)(char)Level_00;
  Brick = BrickAddress;
  BrickAddress_local = (u64)Idx2;
  local_48 = BrickAddress;
  local_40 = Idx2;
  if (0xf < local_24) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uStack_30 = (ulong)local_20->Arr[(int)local_24];
  local_11 = -1;
  if (uStack_30 == 0) {
    local_a9 = 0xff;
  }
  else {
    lVar1 = 0x3f;
    if (uStack_30 != 0) {
      for (; uStack_30 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_a9 = 0x3f - ((byte)lVar1 ^ 0x3f);
  }
  local_31 = local_a9;
  local_10 = uStack_30;
  ConstructFilePath(__return_storage_ptr__,Idx2,
                    (BrickAddress >> 0x12 & 0x3ffffffffff) <<
                    (local_a9 + (uStack_30 != 1L << (local_a9 & 0x3f)) & 0x3f),Level_00,
                    (byte)(BrickAddress >> 0xc) & 0x3f,(short)(((int)BrickAddress << 0x14) >> 0x14))
  ;
  return __return_storage_ptr__;
}

Assistant:

file_id
ConstructFilePath(const idx2_file& Idx2, u64 BrickAddress)
{
  u64 Brick;
  i16 BitPlane;
  i8 Level;
  i8 Subband;
  UnpackFileAddress(Idx2, BrickAddress, &Brick, &Level, &Subband, &BitPlane);
  return ConstructFilePath(Idx2, Brick, Level, Subband, BitPlane);
}